

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxShift::Resolve(FxShift *this,FCompileContext *ctx)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FxConstant *this_00;
  byte bVar4;
  FxExpression *pFVar5;
  uint local_9c;
  uint local_98;
  uint local_94;
  FxExpression *e;
  int local_48;
  int v2;
  ExpVal local_38;
  undefined4 local_24;
  PType *pPStack_20;
  int v1;
  FCompileContext *ctx_local;
  FxShift *this_local;
  
  this_local = this;
  if (((this->super_FxBinary).super_FxExpression.isresolved & 1U) == 0) {
    (this->super_FxBinary).super_FxExpression.isresolved = true;
    pPStack_20 = (PType *)ctx;
    ctx_local = (FCompileContext *)this;
    if ((this->super_FxBinary).left != (FxExpression *)0x0) {
      pFVar5 = (this->super_FxBinary).left;
      iVar2 = (*pFVar5->_vptr_FxExpression[2])(pFVar5,ctx);
      (this->super_FxBinary).left = (FxExpression *)CONCAT44(extraout_var,iVar2);
    }
    if ((this->super_FxBinary).right != (FxExpression *)0x0) {
      pFVar5 = (this->super_FxBinary).right;
      iVar2 = (*pFVar5->_vptr_FxExpression[2])(pFVar5,pPStack_20);
      (this->super_FxBinary).right = (FxExpression *)CONCAT44(extraout_var_00,iVar2);
    }
    if (((this->super_FxBinary).left == (FxExpression *)0x0) ||
       ((this->super_FxBinary).right == (FxExpression *)0x0)) {
      if (this != (FxShift *)0x0) {
        (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])();
      }
      this_local = (FxShift *)0x0;
    }
    else {
      bVar1 = FxExpression::IsNumeric((this->super_FxBinary).left);
      if ((bVar1) && (bVar1 = FxExpression::IsNumeric((this->super_FxBinary).right), bVar1)) {
        bVar1 = FxBinary::Promote(&this->super_FxBinary,(FCompileContext *)pPStack_20,true);
        if (bVar1) {
          if (((this->super_FxBinary).super_FxExpression.ValueType == (PType *)TypeUInt32) &&
             ((this->super_FxBinary).Operator == 0x116)) {
            (this->super_FxBinary).Operator = 0x117;
          }
          uVar3 = (*((this->super_FxBinary).left)->_vptr_FxExpression[3])();
          if (((uVar3 & 1) != 0) &&
             (uVar3 = (*((this->super_FxBinary).right)->_vptr_FxExpression[3])(), (uVar3 & 1) != 0))
          {
            FxConstant::GetValue((FxConstant *)&local_38);
            uVar3 = ExpVal::GetInt(&local_38);
            ExpVal::~ExpVal(&local_38);
            pFVar5 = (this->super_FxBinary).right;
            local_24 = uVar3;
            FxConstant::GetValue((FxConstant *)&e);
            iVar2 = ExpVal::GetInt((ExpVal *)&e);
            ExpVal::~ExpVal((ExpVal *)&e);
            local_48 = iVar2;
            this_00 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pFVar5);
            bVar4 = (byte)local_48;
            if ((this->super_FxBinary).Operator == 0x118) {
              local_94 = local_24 << (bVar4 & 0x1f);
            }
            else {
              if ((this->super_FxBinary).Operator == 0x116) {
                local_98 = (int)local_24 >> (bVar4 & 0x1f);
              }
              else {
                if ((this->super_FxBinary).Operator == 0x117) {
                  local_9c = (uint)local_24 >> (bVar4 & 0x1f);
                }
                else {
                  local_9c = 0;
                }
                local_98 = local_9c;
              }
              local_94 = local_98;
            }
            FxConstant::FxConstant
                      (this_00,local_94,&(this->super_FxBinary).super_FxExpression.ScriptPosition);
            this_local = (FxShift *)this_00;
            if (this != (FxShift *)0x0) {
              (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])();
            }
          }
        }
        else {
          this_local = (FxShift *)0x0;
        }
      }
      else {
        FScriptPosition::Message
                  (&(this->super_FxBinary).super_FxExpression.ScriptPosition,2,
                   "Incompatible operands for shift operation");
        if (this != (FxShift *)0x0) {
          (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])();
        }
        this_local = (FxShift *)0x0;
      }
    }
  }
  return (FxExpression *)this_local;
}

Assistant:

FxExpression *FxShift::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	RESOLVE(left, ctx);
	RESOLVE(right, ctx);
	if (!left || !right)
	{
		delete this;
		return nullptr;
	}

	if (left->IsNumeric() && right->IsNumeric())
	{
		if (!Promote(ctx, true)) return nullptr;
		if (ValueType == TypeUInt32 && Operator == TK_RShift) Operator = TK_URShift;
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Incompatible operands for shift operation");
		delete this;
		return nullptr;
	}

	if (left->isConstant() && right->isConstant())
	{
		int v1 = static_cast<FxConstant *>(left)->GetValue().GetInt();
		int v2 = static_cast<FxConstant *>(right)->GetValue().GetInt();

		FxExpression *e = new FxConstant(
			Operator == TK_LShift ? v1 << v2 :
			Operator == TK_RShift ? v1 >> v2 :
			Operator == TK_URShift ? int((unsigned int)(v1) >> v2) : 0, ScriptPosition);

		delete this;
		return e;
	}
	return this;
}